

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlmodule(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int test_ret;
  int n_name;
  uint uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  uint local_34;
  
  if (quiet == '\0') {
    puts("Testing xmlmodule : 2 of 4 functions ...");
  }
  iVar1 = xmlMemBlocks();
  xmlModuleClose(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlModuleClose",(ulong)(uint)(iVar3 - iVar1));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar8 = &DAT_0015ad48;
  iVar3 = 0;
  uVar6 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar6 < 3) {
      uVar7 = *puVar8;
    }
    else {
      uVar7 = 0;
    }
    xmlModuleSymbol(0,uVar7,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlModuleSymbol",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",0);
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar6 = uVar6 + 1;
    puVar8 = puVar8 + 1;
  } while (uVar6 != 4);
  function_tests = function_tests + 1;
  local_34 = (uint)(iVar1 != iVar2);
  local_34 = iVar3 + local_34;
  if (local_34 != 0) {
    printf("Module xmlmodule: %d errors\n",(ulong)local_34);
  }
  return local_34;
}

Assistant:

static int
test_xmlmodule(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlmodule : 2 of 4 functions ...\n");
    test_ret += test_xmlModuleClose();
    test_ret += test_xmlModuleOpen();
    test_ret += test_xmlModuleSymbol();

    if (test_ret != 0)
	printf("Module xmlmodule: %d errors\n", test_ret);
    return(test_ret);
}